

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O2

void disas_simd_scalar_three_reg_same_extra(DisasContext_conflict1 *s,uint32_t insn)

{
  TCGContext_conflict1 *tcg_ctx;
  _Bool _Var1;
  TCGv_i32 tcg_dest;
  TCGv_i32 tcg_dest_00;
  TCGv_i32 tcg_dest_01;
  TCGv_i64 ret;
  MemOp memop;
  uintptr_t o_1;
  uint uVar2;
  uintptr_t o;
  
  if ((((insn >> 0xb & 0xe | insn >> 0x19 & 0x10) == 0x10) &&
      (memop = insn >> 0x16 & MO_64, 0xfffffffd < memop - MO_64)) &&
     ((s->isar->id_aa64isar0 & 0xf0000000) != 0)) {
    tcg_ctx = s->uc->tcg_ctx;
    _Var1 = fp_access_check(s);
    if (!_Var1) {
      return;
    }
    tcg_dest = tcg_temp_new_i32(tcg_ctx);
    tcg_dest_00 = tcg_temp_new_i32(tcg_ctx);
    tcg_dest_01 = tcg_temp_new_i32(tcg_ctx);
    read_vec_element_i32(s,tcg_dest,insn >> 5 & 0x1f,0,memop);
    read_vec_element_i32(s,tcg_dest_00,insn >> 0x10 & 0x1f,0,memop);
    read_vec_element_i32(s,tcg_dest_01,insn & 0x1f,0,memop);
    uVar2 = insn >> 0xb & 0xf;
    if ((short)uVar2 == 1) {
      if (memop == MO_16) {
        gen_helper_neon_qrdmlsh_s16
                  (tcg_ctx,tcg_dest_01,tcg_ctx->cpu_env,tcg_dest,tcg_dest_00,tcg_dest_01);
      }
      else {
        gen_helper_neon_qrdmlsh_s32
                  (tcg_ctx,tcg_dest_01,tcg_ctx->cpu_env,tcg_dest,tcg_dest_00,tcg_dest_01);
      }
    }
    else {
      if (uVar2 != 0) {
        g_assertion_message_expr
                  ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                   ,0x25bf,(char *)0x0);
      }
      if (memop == MO_16) {
        gen_helper_neon_qrdmlah_s16
                  (tcg_ctx,tcg_dest_01,tcg_ctx->cpu_env,tcg_dest,tcg_dest_00,tcg_dest_01);
      }
      else {
        gen_helper_neon_qrdmlah_s32
                  (tcg_ctx,tcg_dest_01,tcg_ctx->cpu_env,tcg_dest,tcg_dest_00,tcg_dest_01);
      }
    }
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(tcg_dest + (long)tcg_ctx));
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(tcg_dest_00 + (long)tcg_ctx));
    ret = tcg_temp_new_i64(tcg_ctx);
    tcg_gen_extu_i32_i64_aarch64(tcg_ctx,ret,tcg_dest_01);
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(tcg_dest_01 + (long)tcg_ctx));
    write_fp_dreg_aarch64(s,insn & 0x1f,ret);
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
    return;
  }
  unallocated_encoding_aarch64(s);
  return;
}

Assistant:

static void disas_simd_scalar_three_reg_same_extra(DisasContext *s,
                                                   uint32_t insn)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int rd = extract32(insn, 0, 5);
    int rn = extract32(insn, 5, 5);
    int opcode = extract32(insn, 11, 4);
    int rm = extract32(insn, 16, 5);
    int size = extract32(insn, 22, 2);
    bool u = extract32(insn, 29, 1);
    TCGv_i32 ele1, ele2, ele3;
    TCGv_i64 res;
    bool feature;

    switch (u * 16 + opcode) {
    case 0x10: /* SQRDMLAH (vector) */
    case 0x11: /* SQRDMLSH (vector) */
        if (size != 1 && size != 2) {
            unallocated_encoding(s);
            return;
        }
        feature = dc_isar_feature(aa64_rdm, s);
        break;
    default:
        unallocated_encoding(s);
        return;
    }
    if (!feature) {
        unallocated_encoding(s);
        return;
    }
    if (!fp_access_check(s)) {
        return;
    }

    /* Do a single operation on the lowest element in the vector.
     * We use the standard Neon helpers and rely on 0 OP 0 == 0
     * with no side effects for all these operations.
     * OPTME: special-purpose helpers would avoid doing some
     * unnecessary work in the helper for the 16 bit cases.
     */
    ele1 = tcg_temp_new_i32(tcg_ctx);
    ele2 = tcg_temp_new_i32(tcg_ctx);
    ele3 = tcg_temp_new_i32(tcg_ctx);

    read_vec_element_i32(s, ele1, rn, 0, size);
    read_vec_element_i32(s, ele2, rm, 0, size);
    read_vec_element_i32(s, ele3, rd, 0, size);

    switch (opcode) {
    case 0x0: /* SQRDMLAH */
        if (size == 1) {
            gen_helper_neon_qrdmlah_s16(tcg_ctx, ele3, tcg_ctx->cpu_env, ele1, ele2, ele3);
        } else {
            gen_helper_neon_qrdmlah_s32(tcg_ctx, ele3, tcg_ctx->cpu_env, ele1, ele2, ele3);
        }
        break;
    case 0x1: /* SQRDMLSH */
        if (size == 1) {
            gen_helper_neon_qrdmlsh_s16(tcg_ctx, ele3, tcg_ctx->cpu_env, ele1, ele2, ele3);
        } else {
            gen_helper_neon_qrdmlsh_s32(tcg_ctx, ele3, tcg_ctx->cpu_env, ele1, ele2, ele3);
        }
        break;
    default:
        g_assert_not_reached();
    }
    tcg_temp_free_i32(tcg_ctx, ele1);
    tcg_temp_free_i32(tcg_ctx, ele2);

    res = tcg_temp_new_i64(tcg_ctx);
    tcg_gen_extu_i32_i64(tcg_ctx, res, ele3);
    tcg_temp_free_i32(tcg_ctx, ele3);

    write_fp_dreg(s, rd, res);
    tcg_temp_free_i64(tcg_ctx, res);
}